

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O2

void __thiscall
FIX::FileStoreFactory::FileStoreFactory(FileStoreFactory *this,SessionSettings *settings)

{
  *(code **)this = std::logic_error::logic_error;
  *(FileStoreFactory **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (FileStoreFactory)0x0;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x28),settings);
  return;
}

Assistant:

FileStoreFactory( const SessionSettings& settings )
: m_settings( settings ) {}